

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

bool __thiscall
simple_thread_pool::ThreadPoolMgr::returnThread
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  int iVar1;
  iterator iVar2;
  __hashtable *__h;
  size_t local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->idleThreadsLock);
  if (iVar1 == 0) {
    local_40 = ((t_handle->
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->myId;
    iVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->idleThreads)._M_h,&local_40);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_38 = (t_handle->
                 super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_40 = local_38->myId;
      local_30 = (t_handle->
                 super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_30->_M_use_count = local_30->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_30->_M_use_count = local_30->_M_use_count + 1;
        }
      }
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->idleThreads,&local_40);
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->idleThreadsLock);
    return iVar2.
           super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
           ._M_cur == (__node_type *)0x0;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool returnThread(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.find(t_handle->getId());
        if (entry != idleThreads.end()) {
            return false;
        }
        idleThreads.insert({t_handle->getId(), t_handle});
        return true;
    }